

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

PathDependentInfoToRestore __thiscall
GlobOpt::UpdatePathDependentInfo(GlobOpt *this,PathDependentInfo *info)

{
  code *pcVar1;
  bool bVar2;
  PathDependentRelationship PVar3;
  int32 lowerBound;
  int32 upperBound;
  undefined4 *puVar4;
  Value *pVVar5;
  Value *pVVar6;
  ValueInfo *pVVar7;
  long *plVar8;
  ValueInfo *local_d8;
  code *local_b0;
  ValueInfo *newRightValueInfo;
  ValueInfo *newLeftValueInfo;
  IntConstantBounds local_68;
  IntConstantBounds rightConstantBounds;
  ValueInfo *rightValueInfo;
  IntConstantBounds leftConstantBounds;
  ValueInfo *leftValueInfo;
  offset_in_GlobOpt_to_subr UpdateIntBoundsForRightValue;
  code *local_38;
  offset_in_GlobOpt_to_subr UpdateIntBoundsForLeftValue;
  PathDependentInfo *info_local;
  GlobOpt *this_local;
  
  if (info == (PathDependentInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x28b9,"(info)","info");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = PathDependentInfo::HasInfo(info);
  if (bVar2) {
    PVar3 = PathDependentInfo::Relationship(info);
    switch(PVar3) {
    case Equal:
      local_38 = UpdateIntBoundsForEqual;
      UpdateIntBoundsForLeftValue = 0;
      leftValueInfo = (ValueInfo *)UpdateIntBoundsForEqual;
      UpdateIntBoundsForRightValue = 0;
      break;
    case NotEqual:
      local_38 = UpdateIntBoundsForNotEqual;
      UpdateIntBoundsForLeftValue = 0;
      leftValueInfo = (ValueInfo *)UpdateIntBoundsForNotEqual;
      UpdateIntBoundsForRightValue = 0;
      break;
    case GreaterThanOrEqual:
      local_38 = UpdateIntBoundsForGreaterThanOrEqual;
      UpdateIntBoundsForLeftValue = 0;
      leftValueInfo = (ValueInfo *)UpdateIntBoundsForLessThanOrEqual;
      UpdateIntBoundsForRightValue = 0;
      break;
    case GreaterThan:
      local_38 = UpdateIntBoundsForGreaterThan;
      UpdateIntBoundsForLeftValue = 0;
      leftValueInfo = (ValueInfo *)UpdateIntBoundsForLessThan;
      UpdateIntBoundsForRightValue = 0;
      break;
    case LessThanOrEqual:
      local_38 = UpdateIntBoundsForLessThanOrEqual;
      UpdateIntBoundsForLeftValue = 0;
      leftValueInfo = (ValueInfo *)UpdateIntBoundsForGreaterThanOrEqual;
      UpdateIntBoundsForRightValue = 0;
      break;
    case LessThan:
      local_38 = UpdateIntBoundsForLessThan;
      UpdateIntBoundsForLeftValue = 0;
      leftValueInfo = (ValueInfo *)UpdateIntBoundsForGreaterThan;
      UpdateIntBoundsForRightValue = 0;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x28e2,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pVVar5 = PathDependentInfo::LeftValue(info);
    leftConstantBounds = (IntConstantBounds)::Value::GetValueInfo(pVVar5);
    IntConstantBounds::IntConstantBounds((IntConstantBounds *)&rightValueInfo);
    bVar2 = ValueInfo::TryGetIntConstantBounds
                      ((ValueInfo *)leftConstantBounds,(IntConstantBounds *)&rightValueInfo,true);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x28e8,
                         "(leftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true))",
                         "leftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    IntConstantBounds::IntConstantBounds(&local_68);
    pVVar5 = PathDependentInfo::RightValue(info);
    if (pVVar5 == (Value *)0x0) {
      rightConstantBounds.lowerBound = 0;
      rightConstantBounds.upperBound = 0;
      lowerBound = PathDependentInfo::RightConstantValue(info);
      upperBound = PathDependentInfo::RightConstantValue(info);
      IntConstantBounds::IntConstantBounds
                ((IntConstantBounds *)&newLeftValueInfo,lowerBound,upperBound);
      local_68 = (IntConstantBounds)newLeftValueInfo;
    }
    else {
      pVVar5 = PathDependentInfo::RightValue(info);
      rightConstantBounds = (IntConstantBounds)::Value::GetValueInfo(pVVar5);
      bVar2 = ValueInfo::TryGetIntConstantBounds((ValueInfo *)rightConstantBounds,&local_68,true);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x28ef,
                           "(rightValueInfo->TryGetIntConstantBounds(&rightConstantBounds, true))",
                           "rightValueInfo->TryGetIntConstantBounds(&rightConstantBounds, true)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    plVar8 = (long *)((long)&this->byteCodeConstantValueArray + UpdateIntBoundsForLeftValue);
    if (((ulong)local_38 & 1) == 0) {
      local_b0 = local_38;
    }
    else {
      local_b0 = *(code **)(local_38 + *plVar8 + -1);
    }
    pVVar5 = PathDependentInfo::LeftValue(info);
    pVVar6 = PathDependentInfo::RightValue(info);
    pVVar7 = (ValueInfo *)(*local_b0)(plVar8,pVVar5,&rightValueInfo,pVVar6,&local_68);
    if (pVVar7 == (ValueInfo *)0x0) {
      leftConstantBounds.lowerBound = 0;
      leftConstantBounds.upperBound = 0;
    }
    else {
      pVVar5 = PathDependentInfo::LeftValue(info);
      ChangeValueInfo(this,(BasicBlock *)0x0,pVVar5,pVVar7,false,false);
      bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar7,(IntConstantBounds *)&rightValueInfo,true);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2901,
                           "(newLeftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true))",
                           "newLeftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    plVar8 = (long *)((long)&this->byteCodeConstantValueArray + UpdateIntBoundsForRightValue);
    if (((ulong)leftValueInfo & 1) == 0) {
      local_d8 = leftValueInfo;
    }
    else {
      local_d8 = *(ValueInfo **)((long)leftValueInfo + *plVar8 + -1);
    }
    pVVar5 = PathDependentInfo::RightValue(info);
    pVVar6 = PathDependentInfo::LeftValue(info);
    pVVar7 = (ValueInfo *)(*(code *)local_d8)(plVar8,pVVar5,&local_68,pVVar6,&rightValueInfo);
    if (pVVar7 == (ValueInfo *)0x0) {
      rightConstantBounds.lowerBound = 0;
      rightConstantBounds.upperBound = 0;
    }
    else {
      pVVar5 = PathDependentInfo::RightValue(info);
      ChangeValueInfo(this,(BasicBlock *)0x0,pVVar5,pVVar7,false,false);
    }
    PathDependentInfoToRestore::PathDependentInfoToRestore
              ((PathDependentInfoToRestore *)&this_local,(ValueInfo *)leftConstantBounds,
               (ValueInfo *)rightConstantBounds);
  }
  else {
    PathDependentInfoToRestore::PathDependentInfoToRestore
              ((PathDependentInfoToRestore *)&this_local);
  }
  return _this_local;
}

Assistant:

PathDependentInfoToRestore
GlobOpt::UpdatePathDependentInfo(PathDependentInfo *const info)
{
    Assert(info);

    if(!info->HasInfo())
    {
        return PathDependentInfoToRestore();
    }

    decltype(&GlobOpt::UpdateIntBoundsForEqual) UpdateIntBoundsForLeftValue, UpdateIntBoundsForRightValue;
    switch(info->Relationship())
    {
        case PathDependentRelationship::Equal:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForEqual;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForEqual;
            break;

        case PathDependentRelationship::NotEqual:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForNotEqual;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForNotEqual;
            break;

        case PathDependentRelationship::GreaterThanOrEqual:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForGreaterThanOrEqual;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForLessThanOrEqual;
            break;

        case PathDependentRelationship::GreaterThan:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForGreaterThan;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForLessThan;
            break;

        case PathDependentRelationship::LessThanOrEqual:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForLessThanOrEqual;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForGreaterThanOrEqual;
            break;

        case PathDependentRelationship::LessThan:
            UpdateIntBoundsForLeftValue = &GlobOpt::UpdateIntBoundsForLessThan;
            UpdateIntBoundsForRightValue = &GlobOpt::UpdateIntBoundsForGreaterThan;
            break;

        default:
            Assert(false);
            __assume(false);
    }

    ValueInfo *leftValueInfo = info->LeftValue()->GetValueInfo();
    IntConstantBounds leftConstantBounds;
    AssertVerify(leftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true));

    ValueInfo *rightValueInfo;
    IntConstantBounds rightConstantBounds;
    if(info->RightValue())
    {
        rightValueInfo = info->RightValue()->GetValueInfo();
        AssertVerify(rightValueInfo->TryGetIntConstantBounds(&rightConstantBounds, true));
    }
    else
    {
        rightValueInfo = nullptr;
        rightConstantBounds = IntConstantBounds(info->RightConstantValue(), info->RightConstantValue());
    }

    ValueInfo *const newLeftValueInfo =
        (this->*UpdateIntBoundsForLeftValue)(
            info->LeftValue(),
            leftConstantBounds,
            info->RightValue(),
            rightConstantBounds,
            true);
    if(newLeftValueInfo)
    {
        ChangeValueInfo(nullptr, info->LeftValue(), newLeftValueInfo);
        AssertVerify(newLeftValueInfo->TryGetIntConstantBounds(&leftConstantBounds, true));
    }
    else
    {
        leftValueInfo = nullptr;
    }

    ValueInfo *const newRightValueInfo =
        (this->*UpdateIntBoundsForRightValue)(
            info->RightValue(),
            rightConstantBounds,
            info->LeftValue(),
            leftConstantBounds,
            true);
    if(newRightValueInfo)
    {
        ChangeValueInfo(nullptr, info->RightValue(), newRightValueInfo);
    }
    else
    {
        rightValueInfo = nullptr;
    }

    return PathDependentInfoToRestore(leftValueInfo, rightValueInfo);
}